

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O0

bool __thiscall ON_Brep::SetTrimBoundingBoxes(ON_Brep *this,ON_BrepLoop *loop,bool bLazy)

{
  int i;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int *piVar7;
  ON_BrepTrim *pOVar8;
  bool local_41;
  bool bSetLoopBox;
  int lt_count;
  int trim_count;
  int lti;
  int ti;
  bool rc;
  bool bLazy_local;
  ON_BrepLoop *loop_local;
  ON_Brep *this_local;
  
  bVar2 = true;
  iVar4 = ON_ClassArray<ON_BrepTrim>::Count((ON_ClassArray<ON_BrepTrim> *)&this->m_T);
  iVar5 = ON_SimpleArray<int>::Count(&loop->m_ti);
  bVar1 = true;
  if ((bLazy) && (bVar3 = ON_BoundingBox::IsValid(&loop->m_pbox), bVar3)) {
    bVar1 = false;
  }
  else {
    ON_BoundingBox::Destroy(&loop->m_pbox);
  }
  for (lt_count = 0; lt_count < iVar5; lt_count = lt_count + 1) {
    piVar7 = ON_SimpleArray<int>::operator[](&loop->m_ti,lt_count);
    i = *piVar7;
    if ((-1 < i) && (i < iVar4)) {
      pOVar8 = ON_ClassArray<ON_BrepTrim>::operator[]((ON_ClassArray<ON_BrepTrim> *)&this->m_T,i);
      uVar6 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])
                        (this,pOVar8,(ulong)bLazy);
      if ((uVar6 & 1) == 0) {
        bVar2 = false;
      }
      else if (bVar1) {
        pOVar8 = ON_ClassArray<ON_BrepTrim>::operator[]((ON_ClassArray<ON_BrepTrim> *)&this->m_T,i);
        ON_BoundingBox::Union(&loop->m_pbox,&pOVar8->m_pbox);
      }
    }
  }
  local_41 = false;
  if (bVar2) {
    local_41 = ON_BoundingBox::IsValid(&loop->m_pbox);
  }
  return (bool)(-local_41 & 1);
}

Assistant:

bool ON_Brep::SetTrimBoundingBoxes( ON_BrepLoop& loop, bool bLazy )
{
  // TL_Brep overrides this function and computes much tighter
  // bounding boxes that take trim.m_t[] into account.
  bool rc = true;
  int ti, lti, trim_count = m_T.Count(), lt_count = loop.m_ti.Count();
  bool bSetLoopBox = true;
  if ( bLazy && loop.m_pbox.IsValid() )
    bSetLoopBox = false;
  else
    loop.m_pbox.Destroy();
  for ( lti = 0; lti < lt_count; lti++ )
  {
    ti = loop.m_ti[lti];
    if ( ti >= 0 && ti < trim_count )
    {
      if ( !SetTrimBoundingBox( m_T[ti], bLazy ) )
        rc = false;
      else if ( bSetLoopBox )
        loop.m_pbox.Union( m_T[ti].m_pbox );
    }
  }
  return (rc && loop.m_pbox.IsValid()) ? true : false;
}